

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long __thiscall mkvparser::Tracks::Parse(Tracks *this)

{
  ulong uVar1;
  long stop;
  long lVar2;
  bool bVar3;
  long lVar4;
  Track **ppTVar5;
  long lVar6;
  long unaff_R12;
  long unaff_R13;
  longlong element_start;
  bool bVar7;
  ulong uVar8;
  longlong pos;
  longlong size;
  longlong id;
  long local_58;
  Tracks *local_50;
  long local_48;
  long local_40;
  IMkvReader *local_38;
  
  local_58 = this->m_start;
  stop = this->m_size + local_58;
  local_38 = this->m_pSegment->m_pReader;
  uVar8 = 0;
  local_50 = this;
  if (0 < this->m_size) {
    do {
      lVar4 = ParseElementHeader(local_38,&local_58,stop,&local_40,&local_48);
      bVar7 = true;
      if (-1 < lVar4) {
        if (local_48 == 0) {
          bVar7 = false;
          lVar4 = unaff_R12;
        }
        else {
          if (local_40 == 0xae) {
            uVar1 = uVar8 + 1;
            bVar3 = 0x7ffffffe < (long)uVar8;
            lVar4 = -1;
            uVar8 = uVar1;
            if (bVar3) goto LAB_0015c590;
          }
          local_58 = local_48 + local_58;
          bVar7 = stop < local_58;
          lVar4 = unaff_R12;
          if (stop < local_58) {
            lVar4 = -2;
          }
        }
      }
LAB_0015c590:
      unaff_R12 = lVar4;
      if (bVar7) {
        return unaff_R12;
      }
      unaff_R13 = unaff_R12;
    } while (local_58 < stop);
  }
  lVar4 = -2;
  if (local_58 == stop) {
    if ((long)uVar8 < 1) {
      lVar4 = 0;
    }
    else {
      ppTVar5 = (Track **)
                operator_new__(-(ulong)(uVar8 >> 0x3d != 0) | uVar8 << 3,(nothrow_t *)&std::nothrow)
      ;
      local_50->m_trackEntries = ppTVar5;
      if (ppTVar5 == (Track **)0x0) {
        lVar4 = -1;
      }
      else {
        local_50->m_trackEntriesEnd = ppTVar5;
        lVar6 = local_50->m_start;
        do {
          if (stop <= lVar6) {
            return (ulong)(lVar6 == stop) * 2 + -2;
          }
          local_58 = lVar6;
          lVar4 = ParseElementHeader(local_38,&local_58,stop,&local_40,&local_48);
          bVar7 = true;
          if (-1 < lVar4) {
            lVar4 = unaff_R13;
            if (local_48 == 0) {
              bVar7 = false;
            }
            else {
              lVar2 = local_58 + local_48;
              if (local_40 == 0xae) {
                ppTVar5 = local_50->m_trackEntriesEnd;
                *ppTVar5 = (Track *)0x0;
                lVar6 = ParseTrackEntry(local_50,local_58,local_48,lVar6,lVar2 - lVar6,ppTVar5);
                lVar4 = lVar6;
                if ((lVar6 == 0) && (lVar4 = unaff_R13, *ppTVar5 != (Track *)0x0)) {
                  local_50->m_trackEntriesEnd = local_50->m_trackEntriesEnd + 1;
                }
                if (lVar6 != 0) goto LAB_0015c6c4;
              }
              bVar7 = stop < lVar2;
              local_58 = lVar2;
              if (stop < lVar2) {
                lVar4 = -2;
              }
            }
          }
LAB_0015c6c4:
          lVar6 = local_58;
          unaff_R13 = lVar4;
        } while (!bVar7);
      }
    }
  }
  return lVar4;
}

Assistant:

long Tracks::Parse() {
  assert(m_trackEntries == NULL);
  assert(m_trackEntriesEnd == NULL);

  const long long stop = m_start + m_size;
  IMkvReader* const pReader = m_pSegment->m_pReader;

  long long count = 0;
  long long pos = m_start;

  while (pos < stop) {
    long long id, size;

    const long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (size == 0)  // weird
      continue;

    if (id == libwebm::kMkvTrackEntry) {
      ++count;
      if (count > INT_MAX)
        return E_PARSE_FAILED;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  if (count <= 0)
    return 0;  // success

  m_trackEntries = new (std::nothrow) Track*[static_cast<size_t>(count)];

  if (m_trackEntries == NULL)
    return -1;

  m_trackEntriesEnd = m_trackEntries;

  pos = m_start;

  while (pos < stop) {
    const long long element_start = pos;

    long long id, payload_size;

    const long status =
        ParseElementHeader(pReader, pos, stop, id, payload_size);

    if (status < 0)  // error
      return status;

    if (payload_size == 0)  // weird
      continue;

    const long long payload_stop = pos + payload_size;
    assert(payload_stop <= stop);  // checked in ParseElement

    const long long element_size = payload_stop - element_start;

    if (id == libwebm::kMkvTrackEntry) {
      Track*& pTrack = *m_trackEntriesEnd;
      pTrack = NULL;

      const long status = ParseTrackEntry(pos, payload_size, element_start,
                                          element_size, pTrack);
      if (status)
        return status;

      if (pTrack)
        ++m_trackEntriesEnd;
    }

    pos = payload_stop;
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  return 0;  // success
}